

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
mocker::RenameASTDeclarations::renameGlobalVar(RenameASTDeclarations *this,VarDecl *node)

{
  string oldIdent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string
            ((string *)&local_50,
             (string *)
             &((((node->decl).
                 super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               identifier).super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->val);
  std::operator+(&local_30,"@",&local_50);
  std::__cxx11::string::operator=
            ((string *)
             &((((node->decl).
                 super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               identifier).super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->val,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void renameGlobalVar(ast::VarDecl &node) const {
    auto oldIdent = node.decl->identifier->val;
    node.decl->identifier->val = "@" + oldIdent;
  }